

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

void cmd_ln_set_int_r(cmd_ln_t *cmdln,char *name,long iv)

{
  anytype_t *paVar1;
  
  paVar1 = cmd_ln_access_r(cmdln,name);
  if (paVar1 != (anytype_t *)0x0) {
    paVar1->i = iv;
    return;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
          ,0x3fb,"Unknown argument: %s\n",name);
  return;
}

Assistant:

void
cmd_ln_set_int_r(cmd_ln_t *cmdln, char const *name, long iv)
{
    anytype_t *val;
    val = cmd_ln_access_r(cmdln, name);
    if (val == NULL) {
        E_ERROR("Unknown argument: %s\n", name);
        return;
    }
    val->i = iv;
}